

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O3

pair<int,_int> __thiscall
mp::VecReader<std::pair<int,_int>_>::ReadNext(VecReader<std::pair<int,_int>_> *this)

{
  NLW2_SOLReadResultCode NVar1;
  pair<int,_int> v;
  pair<int,_int> local_10;
  
  local_10.first = 0;
  local_10.second = 0;
  this->n_ = this->n_ + -1;
  NVar1 = Read<int>(this->f_,this->binary_,&local_10,&this->err_msg_);
  this->rr_ = NVar1;
  if (NVar1 != NLW2_SOLRead_OK) {
    this->n_ = 0;
  }
  return local_10;
}

Assistant:

Value VecReader<Value>::ReadNext() {
  Value v;
  --n_;                // decrement counter
  assert(n_ >= 0);
  if (NLW2_SOLRead_OK !=
      (rr_ = Read(f_, binary_, v, err_msg_))) {
    n_ = 0;            // return error status
  }
  return v;
}